

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void luaL_addvalue(luaL_Buffer *B)

{
  char *s_00;
  int idx;
  char *s;
  size_t l;
  lua_State *L;
  luaL_Buffer *B_local;
  
  l = (size_t)B->L;
  L = (lua_State *)B;
  s_00 = lua_tolstring((lua_State *)l,-1,(size_t *)&s);
  if (L->next != (GCObject *)&L->ci) {
    lua_rotate((lua_State *)l,-2,1);
  }
  luaL_addlstring((luaL_Buffer *)L,s_00,(size_t)s);
  idx = -1;
  if (L->next != (GCObject *)&L->ci) {
    idx = -2;
  }
  lua_rotate((lua_State *)l,idx,-1);
  lua_settop((lua_State *)l,-2);
  return;
}

Assistant:

LUALIB_API void luaL_addvalue (luaL_Buffer *B) {
  lua_State *L = B->L;
  size_t len;
  const char *s = lua_tolstring(L, -1, &len);
  char *b = prepbuffsize(B, len, -2);
  memcpy(b, s, len * sizeof(char));
  luaL_addsize(B, len);
  lua_pop(L, 1);  /* pop string */
}